

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O0

double __thiscall adios2::VariableNT::MaxDouble(VariableNT *this,size_t step)

{
  char cVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  undefined8 uVar8;
  ulong *in_RDI;
  float fVar9;
  undefined1 auVar10 [16];
  allocator *__rhs;
  allocator *__lhs;
  string local_128 [28];
  int in_stack_fffffffffffffef4;
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string *in_stack_ffffffffffffff68;
  VariableBase *in_stack_ffffffffffffff70;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [48];
  double local_8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"in call to VariableNT::MaxDouble",&local_39);
  helper::CheckForNullptr<adios2::core::VariableBase>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (*(int *)(*in_RDI + 0x28) == 1) {
    cVar1 = adios2::core::Variable<signed_char>::Max(*in_RDI);
    local_8 = (double)(int)cVar1;
  }
  else if (*(int *)(*in_RDI + 0x28) == 5) {
    bVar2 = adios2::core::Variable<unsigned_char>::Max(*in_RDI);
    local_8 = (double)bVar2;
  }
  else if (*(int *)(*in_RDI + 0x28) == 2) {
    sVar3 = adios2::core::Variable<short>::Max(*in_RDI);
    local_8 = (double)(int)sVar3;
  }
  else if (*(int *)(*in_RDI + 0x28) == 6) {
    uVar4 = adios2::core::Variable<unsigned_short>::Max(*in_RDI);
    local_8 = (double)uVar4;
  }
  else if (*(int *)(*in_RDI + 0x28) == 3) {
    iVar5 = adios2::core::Variable<int>::Max(*in_RDI);
    local_8 = (double)iVar5;
  }
  else if (*(int *)(*in_RDI + 0x28) == 7) {
    uVar6 = adios2::core::Variable<unsigned_int>::Max(*in_RDI);
    local_8 = (double)uVar6;
  }
  else if (*(int *)(*in_RDI + 0x28) == 4) {
    lVar7 = adios2::core::Variable<long>::Max(*in_RDI);
    local_8 = (double)lVar7;
  }
  else if (*(int *)(*in_RDI + 0x28) == 8) {
    uVar8 = adios2::core::Variable<unsigned_long>::Max(*in_RDI);
    auVar10._8_4_ = (int)((ulong)uVar8 >> 0x20);
    auVar10._0_8_ = uVar8;
    auVar10._12_4_ = 0x45300000;
    local_8 = (auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
  }
  else if (*(int *)(*in_RDI + 0x28) == 9) {
    fVar9 = (float)adios2::core::Variable<float>::Max(*in_RDI);
    local_8 = (double)fVar9;
  }
  else if (*(int *)(*in_RDI + 0x28) == 10) {
    local_8 = (double)adios2::core::Variable<double>::Max(*in_RDI);
  }
  else {
    __lhs = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"bindings::CXX11",__lhs);
    __rhs = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffff68,"VariableNT",__rhs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"MaxDouble",&local_c1);
    adios2::ToString_abi_cxx11_((DataType)local_128);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (char *)__rhs);
    helper::Throw<std::runtime_error>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

double VariableNT::MaxDouble(const size_t step) const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::MaxDouble");
    if (m_Variable->m_Type == DataType::Int8)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<int8_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::UInt8)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<uint8_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::Int16)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<int16_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::UInt16)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<uint16_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::Int32)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<int32_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::UInt32)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<uint32_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::Int64)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<int64_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::UInt64)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<uint64_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::Float)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<float> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::Double)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<double> *>(m_Variable)->Max(step));
    }
    helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "MaxDouble",
                                      "invalid data type " + ToString(m_Variable->m_Type) +
                                          ", only basic numeric types support this API");
    return 0;
}